

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nested_loop_join_inner.cpp
# Opt level: O1

idx_t duckdb::InitialNestedLoopJoin::Operation<duckdb::interval_t,duckdb::DistinctFrom>
                (Vector *left,Vector *right,idx_t left_size,idx_t right_size,idx_t *lpos,idx_t *rpos
                ,SelectionVector *lvector,SelectionVector *rvector,idx_t current_match_count)

{
  sel_t *psVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  sel_t *psVar4;
  ulong uVar5;
  int *piVar6;
  long lVar7;
  long lVar8;
  int *piVar9;
  ulong uVar10;
  idx_t iVar11;
  bool bVar12;
  bool bVar13;
  UnifiedVectorFormat right_data;
  UnifiedVectorFormat left_data;
  UnifiedVectorFormat local_c0;
  UnifiedVectorFormat local_78;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_c0);
  Vector::ToUnifiedFormat(left,left_size,&local_78);
  Vector::ToUnifiedFormat(right,right_size,&local_c0);
  uVar10 = *rpos;
  if (uVar10 < right_size) {
    psVar1 = (local_c0.sel)->sel_vector;
    iVar11 = 0;
    do {
      if (psVar1 != (sel_t *)0x0) {
        uVar10 = (ulong)psVar1[uVar10];
      }
      if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        bVar12 = false;
      }
      else {
        bVar12 = (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                  [uVar10 >> 6] >> (uVar10 & 0x3f) & 1) == 0;
      }
      bVar13 = *lpos < left_size;
      if (bVar13) {
        if (iVar11 != 0x800) {
          piVar9 = (int *)(local_c0.data + uVar10 * 0x10);
          psVar2 = lvector->sel_vector;
          psVar3 = rvector->sel_vector;
          psVar4 = (local_78.sel)->sel_vector;
          uVar10 = *lpos;
          do {
            uVar5 = uVar10;
            if (psVar4 != (sel_t *)0x0) {
              uVar5 = (ulong)psVar4[uVar10];
            }
            if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              bVar13 = false;
            }
            else {
              bVar13 = (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                        [uVar5 >> 6] >> (uVar5 & 0x3f) & 1) == 0;
            }
            if ((bool)(bVar12 | bVar13)) {
              bVar13 = (bool)(bVar13 ^ bVar12);
LAB_017f9592:
              if (bVar13) {
LAB_017f9596:
                psVar2[iVar11] = (sel_t)uVar10;
                psVar3[iVar11] = (sel_t)*rpos;
                iVar11 = iVar11 + 1;
              }
            }
            else {
              piVar6 = (int *)(local_78.data + uVar5 * 0x10);
              if (((*piVar6 != *piVar9) || (piVar6[1] != piVar9[1])) ||
                 (*(long *)(piVar6 + 2) != *(long *)(piVar9 + 2))) {
                lVar7 = (long)piVar6[1] + *(long *)(piVar6 + 2) / 86400000000;
                lVar8 = (long)piVar9[1] + *(long *)(piVar9 + 2) / 86400000000;
                if (((long)*piVar6 + lVar7 / 0x1e == (long)*piVar9 + lVar8 / 0x1e) &&
                   (lVar7 % 0x1e == lVar8 % 0x1e)) {
                  bVar13 = *(long *)(piVar6 + 2) % 86400000000 !=
                           *(long *)(piVar9 + 2) % 86400000000;
                  goto LAB_017f9592;
                }
                goto LAB_017f9596;
              }
            }
            uVar5 = uVar10 + 1;
            *lpos = uVar5;
            if (left_size - 1 == uVar10) {
              bVar13 = false;
              goto LAB_017f95e9;
            }
            uVar10 = uVar5;
          } while (iVar11 != 0x800);
          bVar13 = uVar5 < left_size;
        }
      }
      else {
LAB_017f95e9:
        *lpos = 0;
      }
      if (bVar13) {
        iVar11 = 0x800;
        break;
      }
      uVar10 = *rpos + 1;
      *rpos = uVar10;
    } while (uVar10 < right_size);
  }
  else {
    iVar11 = 0;
  }
  if (local_c0.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return iVar11;
}

Assistant:

static idx_t Operation(Vector &left, Vector &right, idx_t left_size, idx_t right_size, idx_t &lpos, idx_t &rpos,
	                       SelectionVector &lvector, SelectionVector &rvector, idx_t current_match_count) {
		using MATCH_OP = ComparisonOperationWrapper<OP>;

		// initialize phase of nested loop join
		// fill lvector and rvector with matches from the base vectors
		UnifiedVectorFormat left_data, right_data;
		left.ToUnifiedFormat(left_size, left_data);
		right.ToUnifiedFormat(right_size, right_data);

		auto ldata = UnifiedVectorFormat::GetData<T>(left_data);
		auto rdata = UnifiedVectorFormat::GetData<T>(right_data);
		idx_t result_count = 0;
		for (; rpos < right_size; rpos++) {
			idx_t right_position = right_data.sel->get_index(rpos);
			bool right_is_valid = right_data.validity.RowIsValid(right_position);
			for (; lpos < left_size; lpos++) {
				if (result_count == STANDARD_VECTOR_SIZE) {
					// out of space!
					return result_count;
				}
				idx_t left_position = left_data.sel->get_index(lpos);
				bool left_is_valid = left_data.validity.RowIsValid(left_position);
				if (MATCH_OP::Operation(ldata[left_position], rdata[right_position], !left_is_valid, !right_is_valid)) {
					// emit tuple
					lvector.set_index(result_count, lpos);
					rvector.set_index(result_count, rpos);
					result_count++;
				}
			}
			lpos = 0;
		}
		return result_count;
	}